

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

char * on_fire(permonst *mptr,attack *mattk)

{
  int iVar1;
  char *local_20;
  char *what;
  attack *mattk_local;
  permonst *mptr_local;
  
  iVar1 = monsndx(mptr);
  if (iVar1 == 0x20) goto LAB_00252610;
  if (iVar1 == 0x6e) {
LAB_0025261d:
    local_20 = "boiling";
    return local_20;
  }
  if (iVar1 != 0x6f) {
    if (iVar1 == 0x70) {
LAB_0025262a:
      local_20 = "melting";
      return local_20;
    }
    if (iVar1 != 0x71) {
      if (iVar1 == 0x72) goto LAB_0025261d;
      if (iVar1 == 0x73) {
LAB_00252610:
        local_20 = "already on fire";
        return local_20;
      }
      if (iVar1 != 0x9f) {
        if (iVar1 == 0xa0) goto LAB_00252610;
        if (iVar1 != 0xa1) {
          if (iVar1 == 0xa2) goto LAB_0025261d;
          if ((iVar1 != 0x103) && (1 < iVar1 - 0x107U)) {
            if (iVar1 == 0x109) goto LAB_0025262a;
            if (iVar1 != 0x157) {
              if (mattk->aatyp != '\a') {
                return "on fire";
              }
              return "being roasted";
            }
            goto LAB_00252610;
          }
        }
      }
    }
  }
  local_20 = "heating up";
  return local_20;
}

Assistant:

const char *on_fire(const struct permonst *mptr, const struct attack *mattk)
{
    const char *what;

    switch (monsndx(mptr)) {
    case PM_FLAMING_SPHERE:
    case PM_FIRE_VORTEX:
    case PM_FIRE_ELEMENTAL:
    case PM_SALAMANDER:
	what = "already on fire";
	break;
    case PM_WATER_ELEMENTAL:
    case PM_FOG_CLOUD:
    case PM_STEAM_VORTEX:
	what = "boiling";
	break;
    case PM_ICE_VORTEX:
    case PM_GLASS_GOLEM:
	what = "melting";
	break;
    case PM_STONE_GOLEM:
    case PM_CLAY_GOLEM:
    case PM_GOLD_GOLEM:
    case PM_AIR_ELEMENTAL:
    case PM_EARTH_ELEMENTAL:
    case PM_DUST_VORTEX:
    case PM_ENERGY_VORTEX:
	what = "heating up";
	break;
    default:
	what = (mattk->aatyp == AT_HUGS) ? "being roasted" : "on fire";
	break;
    }
    return what;
}